

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O2

int Vec_VecSortCompare3(Vec_Int_t **pp1,Vec_Int_t **pp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar1 = Vec_IntEntry(*pp1,0);
  iVar2 = Vec_IntEntry(*pp2,0);
  if (iVar1 < iVar2) {
    uVar3 = 0xffffffff;
  }
  else {
    iVar1 = Vec_IntEntry(*pp1,0);
    iVar2 = Vec_IntEntry(*pp2,0);
    uVar3 = (uint)(iVar2 < iVar1);
  }
  return uVar3;
}

Assistant:

static int Vec_VecSortCompare3( Vec_Int_t ** pp1, Vec_Int_t ** pp2 )
{
    if ( Vec_IntEntry(*pp1,0) < Vec_IntEntry(*pp2,0) )
        return -1;
    if ( Vec_IntEntry(*pp1,0) > Vec_IntEntry(*pp2,0) ) 
        return 1;
    return 0; 
}